

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningTest::~TEST_GROUP_CppUTestGroupMemoryLeakWarningTest
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningTest *this)

{
  TEST_GROUP_CppUTestGroupMemoryLeakWarningTest *this_local;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryLeakWarningTest_003d5768;
  DummyMemoryLeakFailure::~DummyMemoryLeakFailure(&this->dummy);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(MemoryLeakWarningTest)
{
    DummyMemoryLeakFailure dummy;
    TestTestingFixture* fixture;

    void setup() _override
    {
        fixture = new TestTestingFixture();
        detector = new MemoryLeakDetector(&dummy);
        allocator = new TestMemoryAllocator;
        memPlugin = new MemoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", detector);
        fixture->installPlugin(memPlugin);
        memPlugin->enable();

        leak1 = NULLPTR;
        leak2 = NULLPTR;
    }

    void teardown() _override
    {
        detector->deallocMemory(allocator, leak1);
        detector->deallocMemory(allocator, leak2);

        delete fixture;
        delete memPlugin;
        delete detector;
        delete allocator;
    }
}